

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_deviate_apply_ext(lys_deviate *dev,lys_node *target,LYEXT_SUBSTMT substmt,lys_ext *extdef)

{
  ly_ctx *ctx_00;
  lys_ext_instance **pplVar1;
  char *pcVar2;
  bool bVar3;
  void *reallocated;
  lys_ext_instance *new;
  int n;
  int m;
  ly_ctx *ctx;
  lys_ext *extdef_local;
  LYEXT_SUBSTMT substmt_local;
  lys_node *target_local;
  lys_deviate *dev_local;
  
  ctx_00 = target->module->ctx;
  new._0_4_ = -1;
  new._4_4_ = -1;
  do {
    do {
      new._4_4_ = lys_ext_iter(dev->ext,dev->ext_size,(char)new._4_4_ + '\x01',substmt);
      if (new._4_4_ == -1) {
        while (new._0_4_ = lys_ext_iter(target->ext,target->ext_size,(char)(int)new + '\x01',substmt
                                       ), (int)new != -1) {
          if ((substmt != LYEXT_SUBSTMT_SELF) ||
             ((target->ext[(int)new]->def == extdef &&
              ((dev->mod != LY_DEVIATE_ADD || ((target->ext[(int)new]->flags & 1) != 0)))))) {
            lyp_ext_instance_rm(ctx_00,&target->ext,&target->ext_size,(uint8_t)(int)new);
            new._0_4_ = (int)new + -1;
          }
        }
        return 0;
      }
    } while ((substmt == LYEXT_SUBSTMT_SELF) && (dev->ext[new._4_4_]->def != extdef));
    if ((substmt == LYEXT_SUBSTMT_SELF) && (dev->mod == LY_DEVIATE_ADD)) {
      do {
        new._0_4_ = lys_ext_iter(target->ext,target->ext_size,(char)(int)new + '\x01',
                                 LYEXT_SUBSTMT_SELF);
        bVar3 = false;
        if (((int)new != -1) && (bVar3 = true, target->ext[(int)new]->def == extdef)) {
          bVar3 = (target->ext[(int)new]->flags & 1) == 0;
        }
      } while (bVar3);
    }
    else {
      do {
        new._0_4_ = lys_ext_iter(target->ext,target->ext_size,(char)(int)new + '\x01',substmt);
        bVar3 = false;
        if (((int)new != -1) && (bVar3 = false, substmt == LYEXT_SUBSTMT_SELF)) {
          bVar3 = target->ext[(int)new]->def != extdef;
        }
      } while (bVar3);
    }
    if ((int)new == -1) {
      reallocated = malloc(0x40);
      if (reallocated == (void *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_deviate_apply_ext");
        return 1;
      }
      pplVar1 = (lys_ext_instance **)realloc(target->ext,(long)(int)(target->ext_size + 1) << 3);
      if (pplVar1 == (lys_ext_instance **)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_deviate_apply_ext");
        free(reallocated);
        return 1;
      }
      target->ext = pplVar1;
      target->ext_size = target->ext_size + '\x01';
      new._0_4_ = target->ext_size - 1;
    }
    else {
      lys_extension_instances_free
                (ctx_00,target->ext[(int)new]->ext,(uint)target->ext[(int)new]->ext_size,
                 (_func_void_lys_node_ptr_void_ptr *)0x0);
      lydict_remove(ctx_00,target->ext[(int)new]->arg_value);
      free(target->ext[(int)new]);
      reallocated = malloc(0x40);
      if (reallocated == (void *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_deviate_apply_ext");
        return 1;
      }
    }
    target->ext[(int)new] = (lys_ext_instance *)reallocated;
    target->ext[(int)new]->def = dev->ext[new._4_4_]->def;
    pcVar2 = lydict_insert(ctx_00,dev->ext[new._4_4_]->arg_value,0);
    target->ext[(int)new]->arg_value = pcVar2;
    target->ext[(int)new]->flags = 0;
    target->ext[(int)new]->parent = target;
    target->ext[(int)new]->parent_type = '\x01';
    target->ext[(int)new]->insubstmt = (uint8_t)substmt;
    target->ext[(int)new]->insubstmt_index = dev->ext[new._4_4_]->insubstmt_index;
    target->ext[(int)new]->ext_size = dev->ext[new._4_4_]->ext_size;
    lys_ext_dup(ctx_00,target->module,dev->ext[new._4_4_]->ext,dev->ext[new._4_4_]->ext_size,target,
                LYEXT_PAR_NODE,&target->ext[(int)new]->ext,1,(unres_schema *)0x0);
    target->ext[(int)new]->nodetype = LYS_EXT;
    target->ext[(int)new]->module = target->module;
    target->ext[(int)new]->priv = (void *)0x0;
  } while( true );
}

Assistant:

static int
lyp_deviate_apply_ext(struct lys_deviate *dev, struct lys_node *target, LYEXT_SUBSTMT substmt, struct lys_ext *extdef)
{
    struct ly_ctx *ctx;
    int m, n;
    struct lys_ext_instance *new;
    void *reallocated;

    /* LY_DEVIATE_ADD and LY_DEVIATE_RPL are very similar so they are implement the same way - in replacing,
     * there can be some extension instances in the target, in case of adding, there should not be any so we
     * will be just adding. */

    ctx = target->module->ctx; /* shortcut */
    m = n = -1;

    while ((m = lys_ext_iter(dev->ext, dev->ext_size, m + 1, substmt)) != -1) {
        /* deviate and its substatements include extensions, copy them to the target, replacing the previous
         * extensions if any. In case of deviating extension itself, we have to deviate only the same type
         * of the extension as specified in the deviation */
        if (substmt == LYEXT_SUBSTMT_SELF && dev->ext[m]->def != extdef) {
            continue;
        }

        if (substmt == LYEXT_SUBSTMT_SELF && dev->mod == LY_DEVIATE_ADD) {
            /* in case of adding extension, we will be replacing only the inherited extensions */
            do {
                n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt);
            } while (n != -1 && (target->ext[n]->def != extdef || !(target->ext[n]->flags & LYEXT_OPT_INHERIT)));
        } else {
            /* get the index of the extension to replace in the target node */
            do {
                n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt);
                /* if we are applying extension deviation, we have to deviate only the same type of the extension */
            } while (n != -1 && substmt == LYEXT_SUBSTMT_SELF && target->ext[n]->def != extdef);
        }

        if (n == -1) {
            /* nothing to replace, we are going to add it - reallocate */
            new = malloc(sizeof **target->ext);
            LY_CHECK_ERR_RETURN(!new, LOGMEM(ctx), EXIT_FAILURE);
            reallocated = realloc(target->ext, (target->ext_size + 1) * sizeof *target->ext);
            LY_CHECK_ERR_RETURN(!reallocated, LOGMEM(ctx); free(new), EXIT_FAILURE);
            target->ext = reallocated;
            target->ext_size++;

            n = target->ext_size - 1;
        } else {
            /* replacing - the original set of extensions is actually backuped together with the
             * node itself, so we are supposed only to free the allocated data here ... */
            lys_extension_instances_free(ctx, target->ext[n]->ext, target->ext[n]->ext_size, NULL);
            lydict_remove(ctx, target->ext[n]->arg_value);
            free(target->ext[n]);

            /* and prepare the new structure */
            new = malloc(sizeof **target->ext);
            LY_CHECK_ERR_RETURN(!new, LOGMEM(ctx), EXIT_FAILURE);
        }
        /* common part for adding and replacing - fill the newly created / replaced cell */
        target->ext[n] = new;
        target->ext[n]->def = dev->ext[m]->def;
        target->ext[n]->arg_value = lydict_insert(ctx, dev->ext[m]->arg_value, 0);
        target->ext[n]->flags = 0;
        target->ext[n]->parent = target;
        target->ext[n]->parent_type = LYEXT_PAR_NODE;
        target->ext[n]->insubstmt = substmt;
        target->ext[n]->insubstmt_index = dev->ext[m]->insubstmt_index;
        target->ext[n]->ext_size = dev->ext[m]->ext_size;
        lys_ext_dup(ctx, target->module, dev->ext[m]->ext, dev->ext[m]->ext_size, target, LYEXT_PAR_NODE,
                    &target->ext[n]->ext, 1, NULL);
        target->ext[n]->nodetype = LYS_EXT;
        target->ext[n]->module = target->module;
        target->ext[n]->priv = NULL;

        /* TODO cover complex extension instances */
    }

    /* remove the rest of extensions belonging to the original substatement in the target node,
     * due to possible reverting of the deviation effect, they are actually not removed, just moved
     * to the backup of the original node when the original node is backuped, here we just have to
     * free the replaced / deleted originals */
    while ((n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt)) != -1) {
        if (substmt == LYEXT_SUBSTMT_SELF) {
            /* if we are applying extension deviation, we are going to remove only
             * - the same type of the extension in case of replacing
             * - the same type of the extension which was inherited in case of adding
             * note - delete deviation is covered in lyp_deviate_del_ext */
            if (target->ext[n]->def != extdef ||
                    (dev->mod == LY_DEVIATE_ADD && !(target->ext[n]->flags & LYEXT_OPT_INHERIT))) {
                /* keep this extension */
                continue;
            }

        }

        /* remove the item */
        lyp_ext_instance_rm(ctx, &target->ext, &target->ext_size, n);
        --n;
    }

    return EXIT_SUCCESS;
}